

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O2

sc_string_old __thiscall sc_dt::operator+(sc_dt *this,char *s,sc_string_old *t)

{
  int iVar1;
  size_t sVar2;
  sc_string_rep *this_00;
  
  sVar2 = strlen(s);
  this_00 = (sc_string_rep *)operator_new(0x10);
  iVar1 = sc_string_old::length(t);
  sc_string_rep::sc_string_rep(this_00,iVar1 + (int)sVar2 + 1);
  strcpy(this_00->str,s);
  strcpy(this_00->str + (int)sVar2,t->rep->str);
  sc_string_old::sc_string_old((sc_string_old *)this,this_00);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
operator+( const char* s, const sc_string_old& t )
{
    int len = strlen(s);
    sc_string_rep* r = new sc_string_rep( len + t.length() + 1 );
    strcpy( r->str, s );
    strcpy( r->str + len, t );
    return sc_string_old(r);
}